

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.hpp
# Opt level: O1

void __thiscall
boost::python::
class_<timestamp_t,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
::class_(class_<timestamp_t,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
         *this,char *name,char *doc)

{
  type_info local_38;
  type_info local_30;
  type_info local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  local_28.m_base_type = "11timestamp_t";
  objects::class_base::class_base(&this->super_class_base,name,1,&local_28,doc);
  local_28.m_base_type = (base_id_t)0x0;
  uStack_20 = 0;
  local_18 = 0;
  converter::registry::insert
            (converter::shared_ptr_from_python<timestamp_t,_boost::shared_ptr>::convertible,
             converter::shared_ptr_from_python<timestamp_t,_boost::shared_ptr>::construct,
             (type_info)"N5boost10shared_ptrI11timestamp_tEE",
             converter::expected_from_python_type_direct<timestamp_t>::get_pytype);
  converter::registry::insert
            (converter::shared_ptr_from_python<timestamp_t,_std::shared_ptr>::convertible,
             converter::shared_ptr_from_python<timestamp_t,_std::shared_ptr>::construct,
             (type_info)"St10shared_ptrI11timestamp_tE",
             converter::expected_from_python_type_direct<timestamp_t>::get_pytype);
  objects::register_dynamic_id_aux
            ((type_info)"11timestamp_t",objects::non_polymorphic_id_generator<timestamp_t>::execute)
  ;
  converter::registry::insert
            (converter::
             as_to_python_function<timestamp_t,_boost::python::objects::class_cref_wrapper<timestamp_t,_boost::python::objects::make_instance<timestamp_t,_boost::python::objects::value_holder<timestamp_t>_>_>_>
             ::convert,(type_info)"11timestamp_t",
             to_python_converter<timestamp_t,_boost::python::objects::class_cref_wrapper<timestamp_t,_boost::python::objects::make_instance<timestamp_t,_boost::python::objects::value_holder<timestamp_t>_>_>,_true>
             ::get_pytype_impl);
  local_30.m_base_type = "11timestamp_t";
  local_38.m_base_type = "11timestamp_t";
  objects::copy_class_object(&local_30,&local_38);
  objects::class_base::set_instance_size(&this->super_class_base,0x20);
  detail::define_class_init_helper<0>::
  apply<boost::python::class_<timestamp_t,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>,boost::python::default_call_policies,boost::mpl::vector0<mpl_::na>,boost::mpl::size<boost::mpl::vector0<mpl_::na>>>
            (this,&local_30,&local_38,local_28.m_base_type);
  return;
}

Assistant:

inline class_<W,X1,X2,X3>::class_(char const* name, char const* doc)
    : base(name, id_vector::size, id_vector().ids, doc)
{
    this->initialize(init<>());
//  select_holder::assert_default_constructible();
}